

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeSelect
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,optional<wasm::Type> type)

{
  bool bVar1;
  Select *expr;
  undefined1 local_a0 [8];
  Select curr;
  undefined1 local_58 [8];
  Result<wasm::Ok> _val;
  
  local_a0[0] = SelectId;
  curr.super_SpecificExpression<(wasm::Expression::Id)17>.super_Expression._id = InvalidId;
  curr.super_SpecificExpression<(wasm::Expression::Id)17>.super_Expression._1_7_ = 0;
  visitExpression((Result<wasm::Ok> *)local_58,this,(Expression *)local_a0);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string((string *)&curr.condition,(string *)local_58);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&curr.condition)
    ;
    std::__cxx11::string::~string((string *)&curr.condition);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
    expr = Builder::makeSelect(&this->builder,curr.ifFalse,
                               (Expression *)
                               curr.super_SpecificExpression<(wasm::Expression::Id)17>.
                               super_Expression.type.id,curr.ifTrue);
    if ((((undefined1  [16])
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type> & (undefined1  [16])0x1) != (undefined1  [16])0x0
        ) && (bVar1 = wasm::Type::isSubType
                                ((Type)(expr->super_SpecificExpression<(wasm::Expression::Id)17>).
                                       super_Expression.type.id,
                                 type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                                 super__Optional_payload_base<wasm::Type>._M_payload._M_value),
             !bVar1)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58,"select type does not match expected type",
                 (allocator<char> *)&curr.condition);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_58);
      std::__cxx11::string::~string((string *)local_58);
      return __return_storage_ptr__;
    }
    push(this,(Expression *)expr);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeSelect(std::optional<Type> type) {
  Select curr;
  CHECK_ERR(visitSelect(&curr));
  auto* built = builder.makeSelect(curr.condition, curr.ifTrue, curr.ifFalse);
  if (type && !Type::isSubType(built->type, *type)) {
    return Err{"select type does not match expected type"};
  }
  push(built);
  return Ok{};
}